

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  byte bVar4;
  unsigned_short uVar5;
  int iVar6;
  BOOL BVar7;
  uint32 uVar8;
  undefined4 *puVar9;
  BigDictionaryTypeHandler *this_00;
  JavascriptFunction *pJVar10;
  GlobalObject *pGVar11;
  ScriptContext *this_01;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar12;
  GlobalObject *pGVar13;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar14;
  RecyclerWeakReference<Js::DynamicObject> *pRVar15;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPVar16;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar17;
  Var pvVar18;
  bool local_151;
  RuntimeFunction *local_150;
  bool local_f1;
  DynamicObject *local_f0;
  bool local_c9;
  undefined1 local_c0 [16];
  Type local_b0;
  DynamicObject *localSingletonInstance;
  DictionaryPropertyDescriptor<unsigned_short> newDescriptor;
  unsigned_short setterIndex;
  unsigned_short getterIndex;
  undefined1 local_90 [16];
  Var oldSetter;
  Var oldGetter;
  DynamicObject *localSingletonInstance_1;
  PropertyRecord *propertyRecord;
  bool isSetterSet;
  Type TStack_60;
  bool isGetterSet;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  Type local_50;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  Type TStack_38;
  PropertyOperationFlags flags_local;
  Var setter_local;
  Var getter_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  library._4_4_ = flags;
  TStack_38.ptr = (RuntimeFunction *)setter;
  setter_local = getter;
  getter_local._4_4_ = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x653,"(instance)","instance");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  scriptContext = (ScriptContext *)RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
  local_50.ptr = (RuntimeFunction *)RecyclableObject::GetScriptContext(TStack_20.ptr);
  bVar3 = DynamicTypeHandler::VerifyIsExtensible
                    (&this->super_DynamicTypeHandler,(ScriptContext *)local_50.ptr,false);
  local_c9 = true;
  if (!bVar3) {
    iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x11])
                      (this,TStack_20.ptr,(ulong)getter_local._4_4_,0);
    TVar2.ptr = TStack_20.ptr;
    local_c9 = true;
    if (iVar6 == 0) {
      PropertyIds::PropertyIds((PropertyIds *)((long)&descriptor + 4),getter_local._4_4_);
      local_c9 = JavascriptFunction::IsBuiltinProperty(TVar2.ptr,descriptor._4_4_);
    }
  }
  if (((local_c9 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x658,
                                "(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId))"
                                ,
                                "this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  iVar6 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (iVar6 + -2 < (int)(uint)this->nextPropertyIndex) {
    iVar6 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    if (0xfffc < iVar6) {
      this_00 = ConvertToBigDictionaryTypeHandler(this,(DynamicObject *)TStack_20.ptr);
      BVar7 = DictionaryTypeHandlerBase<int>::SetAccessors
                        (this_00,(DynamicObject *)TStack_20.ptr,getter_local._4_4_,setter_local,
                         TStack_38.ptr,library._4_4_);
      return BVar7;
    }
    EnsureSlotCapacity(this,(DynamicObject *)TStack_20.ptr,2);
  }
  bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if ((bVar4 & 0x20) != 0) {
    ScriptContext::InvalidateProtoCaches((ScriptContext *)local_50.ptr,getter_local._4_4_);
  }
  pvVar18 = setter_local;
  propertyRecord._7_1_ = 1;
  propertyRecord._6_1_ = 1;
  if ((setter_local == (Var)0x0) ||
     (pJVar10 = JavascriptLibrary::GetDefaultAccessorFunction((JavascriptLibrary *)scriptContext),
     (JavascriptFunction *)pvVar18 == pJVar10)) {
    propertyRecord._7_1_ = 0;
  }
  TVar2.ptr = TStack_38.ptr;
  if (((GlobalObject *)TStack_38.ptr == (GlobalObject *)0x0) ||
     (pGVar11 = (GlobalObject *)
                JavascriptLibrary::GetDefaultAccessorFunction((JavascriptLibrary *)scriptContext),
     (GlobalObject *)TVar2.ptr == pGVar11)) {
    propertyRecord._6_1_ = 0;
  }
  if (getter_local._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x677,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
  localSingletonInstance_1 =
       (DynamicObject *)ScriptContext::GetPropertyName(this_01,getter_local._4_4_);
  pBVar12 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)pBVar12,(PropertyRecord **)&localSingletonInstance_1,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&stack0xffffffffffffffa0);
  if (!bVar3) {
    bVar3 = PropertyRecord::IsNumeric((PropertyRecord *)localSingletonInstance_1);
    TVar2.ptr = TStack_20.ptr;
    if (bVar3) {
      uVar8 = PropertyRecord::GetNumericValue((PropertyRecord *)localSingletonInstance_1);
      iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x30])
                        (this,TVar2.ptr,(ulong)uVar8,setter_local,TStack_38.ptr);
      return iVar6;
    }
    setter_local = DynamicTypeHandler::CanonicalizeAccessor
                             (setter_local,(JavascriptLibrary *)scriptContext);
    TStack_38.ptr =
         (RuntimeFunction *)
         DynamicTypeHandler::CanonicalizeAccessor(TStack_38.ptr,(JavascriptLibrary *)scriptContext);
    newDescriptor.Data = ::Math::PostInc<unsigned_short>(&this->nextPropertyIndex);
    newDescriptor._0_2_ = ::Math::PostInc<unsigned_short>(&this->nextPropertyIndex);
    DictionaryPropertyDescriptor<unsigned_short>::DictionaryPropertyDescriptor
              ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 4),
               newDescriptor.Data,newDescriptor._0_2_,false,false,false);
    iVar6 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    if (iVar6 < (int)(uint)this->nextPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e6,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e9,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    ppRVar14 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar14 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_150 = (RuntimeFunction *)0x0;
    }
    else {
      pRVar15 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      local_150 = (RuntimeFunction *)Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar15);
    }
    local_b0.ptr = local_150;
    ppRVar14 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if ((*ppRVar14 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       (local_b0.ptr != TStack_20.ptr)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6ec,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    DictionaryPropertyDescriptor<unsigned_short>::SetIsInitialized
              ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 4),
               true);
    if ((local_b0.ptr == TStack_20.ptr) &&
       (BVar7 = IsInternalPropertyId(getter_local._4_4_), BVar7 == 0)) {
      BVar7 = RecyclableObject::IsExternal((RecyclableObject *)TStack_20.ptr);
      if ((BVar7 != 0) &&
         ((library._4_4_ & PropertyOperation_NonFixedValue) == PropertyOperation_None)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x6f1,
                                    "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                    ,
                                    "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      local_151 = false;
      if ((library._4_4_ & PropertyOperation_NonFixedValue) == PropertyOperation_None) {
        local_151 = DynamicTypeHandler::ShouldFixAccessorProperties();
      }
      DictionaryPropertyDescriptor<unsigned_short>::SetIsFixed
                ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 4)
                 ,local_151);
      if (((propertyRecord._7_1_ & 1) == 0) || ((propertyRecord._6_1_ & 1) == 0)) {
        DictionaryPropertyDescriptor<unsigned_short>::SetIsOnlyOneAccessorInitialized
                  ((DictionaryPropertyDescriptor<unsigned_short> *)
                   ((long)&localSingletonInstance + 4),true);
      }
    }
    pBVar12 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(pBVar12,(PropertyRecord **)&localSingletonInstance_1,
          (DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 4));
    TVar2.ptr = TStack_20.ptr;
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)
                       ((long)&localSingletonInstance + 4));
    DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)TVar2.ptr,(uint)uVar5,setter_local);
    TVar2.ptr = TStack_20.ptr;
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)
                       ((long)&localSingletonInstance + 4));
    DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)TVar2.ptr,(uint)uVar5,TStack_38.ptr);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)(local_c0 + 8));
    pPVar16 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )(local_c0 + 8));
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              (pPVar16,&this->super_DynamicTypeHandler,'\0',
               (PropertyRecord *)localSingletonInstance_1,(ScriptContext *)local_50.ptr);
    JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache((JavascriptLibrary *)local_c0);
    pPVar17 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                         local_c0);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              (pPVar17,&this->super_DynamicTypeHandler,'\0',
               (PropertyRecord *)localSingletonInstance_1,(ScriptContext *)local_50.ptr);
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,getter_local._4_4_,
               (Var)0x0,SideEffects_Any);
    TVar2.ptr = TStack_20.ptr;
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)
                       ((long)&localSingletonInstance + 4));
    pvVar18 = DynamicObject::GetSlot((DynamicObject *)TVar2.ptr,(uint)uVar5);
    TVar2.ptr = TStack_20.ptr;
    if (pvVar18 != (Var)0x0) {
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)
                         ((long)&localSingletonInstance + 4));
      pvVar18 = DynamicObject::GetSlot((DynamicObject *)TVar2.ptr,(uint)uVar5);
      if (pvVar18 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x708,
                                "(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr)"
                                ,
                                "instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr"
                               );
    if (bVar3) {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
      return 1;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar3 = DictionaryPropertyDescriptor<unsigned_short>::SanityCheckFixedBits
                    ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x67c,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (((ulong)((TStack_60.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject
              .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject &
      0x800) != 0) {
    if (((ulong)((TStack_60.ptr)->super_JavascriptFunction).super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x1000) == 0) {
      *(PropertyAttributes *)
       ((long)&((TStack_60.ptr)->super_JavascriptFunction).super_DynamicObject.
               super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject + 1) = '\a';
    }
    else {
      *(byte *)((long)&((TStack_60.ptr)->super_JavascriptFunction).super_DynamicObject.
                       super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject + 1) =
           *(PropertyAttributes *)
            ((long)&((TStack_60.ptr)->super_JavascriptFunction).super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject + 1) & 0xd0 | 7;
    }
  }
  bVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetIsAccessor
                    ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
  if (!bVar3) {
    setter_local = DynamicTypeHandler::CanonicalizeAccessor
                             (setter_local,(JavascriptLibrary *)scriptContext);
    TStack_38.ptr =
         (RuntimeFunction *)
         DynamicTypeHandler::CanonicalizeAccessor(TStack_38.ptr,(JavascriptLibrary *)scriptContext);
  }
  bVar3 = DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter
                    ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr,
                     &this->nextPropertyIndex);
  if ((bVar3) &&
     (iVar6 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler),
     iVar6 < (int)(uint)this->nextPropertyIndex)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x694,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                "this->GetSlotCapacity() >= nextPropertyIndex");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x698,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  ppRVar14 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                       ((WriteBarrierPtr *)&this->singletonInstance);
  if (*ppRVar14 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    local_f0 = (DynamicObject *)0x0;
  }
  else {
    pRVar15 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        (&this->singletonInstance);
    local_f0 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar15);
  }
  oldGetter = local_f0;
  ppRVar14 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                       ((WriteBarrierPtr *)&this->singletonInstance);
  if ((*ppRVar14 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((RuntimeFunction *)oldGetter != TStack_20.ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x69b,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetIsInitialized
                    ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
  if (bVar3) {
    bVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetIsOnlyOneAccessorInitialized
                      ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
    TVar2.ptr = TStack_20.ptr;
    if (bVar3) {
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
      oldSetter = DynamicTypeHandler::GetSlot
                            (&this->super_DynamicTypeHandler,(DynamicObject *)TVar2.ptr,(uint)uVar5)
      ;
      TVar2.ptr = TStack_20.ptr;
      uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
      pGVar11 = (GlobalObject *)
                DynamicTypeHandler::GetSlot
                          (&this->super_DynamicTypeHandler,(DynamicObject *)TVar2.ptr,(uint)uVar5);
      local_90._8_8_ = pGVar11;
      if ((((setter_local == oldSetter) || ((propertyRecord._7_1_ & 1) == 0)) &&
          (pGVar13 = (GlobalObject *)
                     JavascriptLibrary::GetDefaultAccessorFunction
                               ((JavascriptLibrary *)scriptContext), pGVar11 == pGVar13)) ||
         (((pvVar18 = oldSetter, TStack_38.ptr == (RuntimeFunction *)local_90._8_8_ ||
           ((propertyRecord._6_1_ & 1) == 0)) &&
          (pJVar10 = JavascriptLibrary::GetDefaultAccessorFunction
                               ((JavascriptLibrary *)scriptContext),
          (JavascriptFunction *)pvVar18 == pJVar10)))) {
        DictionaryPropertyDescriptor<unsigned_short>::SetIsOnlyOneAccessorInitialized
                  ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr,false);
      }
      else {
        InvalidateFixedField<int>
                  (this,(DynamicObject *)TStack_20.ptr,getter_local._4_4_,
                   (DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
      }
    }
    else {
      InvalidateFixedField<int>
                (this,(DynamicObject *)TStack_20.ptr,getter_local._4_4_,
                 (DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
    }
  }
  else {
    DictionaryPropertyDescriptor<unsigned_short>::SetIsInitialized
              ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr,true);
    if (((RuntimeFunction *)oldGetter == TStack_20.ptr) &&
       (BVar7 = IsInternalPropertyId(getter_local._4_4_), BVar7 == 0)) {
      BVar7 = RecyclableObject::IsExternal((RecyclableObject *)TStack_20.ptr);
      if ((BVar7 != 0) &&
         ((library._4_4_ & PropertyOperation_NonFixedValue) == PropertyOperation_None)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x6a5,
                                    "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                    ,
                                    "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      TVar2.ptr = TStack_60.ptr;
      local_f1 = false;
      if ((library._4_4_ & PropertyOperation_NonFixedValue) == PropertyOperation_None) {
        local_f1 = DynamicTypeHandler::ShouldFixAccessorProperties();
      }
      DictionaryPropertyDescriptor<unsigned_short>::SetIsFixed
                ((DictionaryPropertyDescriptor<unsigned_short> *)TVar2.ptr,local_f1);
    }
    if (((propertyRecord._7_1_ & 1) == 0) || ((propertyRecord._6_1_ & 1) == 0)) {
      DictionaryPropertyDescriptor<unsigned_short>::SetIsOnlyOneAccessorInitialized
                ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr,true);
    }
  }
  if (setter_local != (Var)0x0) {
    setter_local = DynamicTypeHandler::CanonicalizeAccessor
                             (setter_local,(JavascriptLibrary *)scriptContext);
    TVar2.ptr = TStack_20.ptr;
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
    DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)TVar2.ptr,(uint)uVar5,setter_local);
  }
  if ((GlobalObject *)TStack_38.ptr != (GlobalObject *)0x0) {
    TStack_38.ptr =
         (RuntimeFunction *)
         DynamicTypeHandler::CanonicalizeAccessor(TStack_38.ptr,(JavascriptLibrary *)scriptContext);
    TVar2.ptr = TStack_20.ptr;
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
    DynamicTypeHandler::SetSlotUnchecked((DynamicObject *)TVar2.ptr,(uint)uVar5,TStack_38.ptr);
  }
  DynamicObject::ChangeType((DynamicObject *)TStack_20.ptr);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache((JavascriptLibrary *)local_90);
  pPVar16 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       local_90);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (pPVar16,&this->super_DynamicTypeHandler,'\0',(PropertyRecord *)localSingletonInstance_1
             ,(ScriptContext *)local_50.ptr);
  JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
            ((JavascriptLibrary *)&newDescriptor.Getter);
  pPVar17 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                       &newDescriptor.Getter);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (pPVar17,&this->super_DynamicTypeHandler,'\0',(PropertyRecord *)localSingletonInstance_1
             ,(ScriptContext *)local_50.ptr);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,getter_local._4_4_,
             (Var)0x0,SideEffects_Any);
  TVar2.ptr = TStack_20.ptr;
  uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                    ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
  pvVar18 = DynamicObject::GetSlot((DynamicObject *)TVar2.ptr,(uint)uVar5);
  TVar2.ptr = TStack_20.ptr;
  if (pvVar18 != (Var)0x0) {
    uVar5 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)TStack_60.ptr);
    pvVar18 = DynamicObject::GetSlot((DynamicObject *)TVar2.ptr,(uint)uVar5);
    if (pvVar18 != (Var)0x0) {
      return 1;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar9 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                              ,0x6d5,
                              "(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr)"
                              ,
                              "instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr"
                             );
  if (bVar3) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
    return 1;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        Assert(instance);
        JavascriptLibrary* library = instance->GetLibrary();
        ScriptContext* scriptContext = instance->GetScriptContext();

        Assert(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId)
            || JavascriptFunction::IsBuiltinProperty(instance, propertyId));

        // We could potentially need 2 new slots to hold getter/setter, try pre-reserve
        if (this->GetSlotCapacity() - 2 < nextPropertyIndex)
        {
            if (this->GetSlotCapacity() > MaxPropertyIndexSize - 2)
            {
                return ConvertToBigDictionaryTypeHandler(instance)
                    ->SetAccessors(instance, propertyId, getter, setter, flags);
            }

            this->EnsureSlotCapacity(instance, 2);
        }

        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->GetFlags() & IsPrototypeFlag)
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }

        bool isGetterSet = true;
        bool isSetterSet = true;
        if (!getter || getter == library->GetDefaultAccessorFunction())
        {
            isGetterSet = false;
        }
        if (!setter || setter == library->GetDefaultAccessorFunction())
        {
            isSetterSet = false;
        }

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
            }

            if (!descriptor->GetIsAccessor())
            {
                // New getter/setter, make sure both values are not null and set to the slots
                getter = CanonicalizeAccessor(getter, library);
                setter = CanonicalizeAccessor(setter, library);
            }

            // conversion from data-property to accessor property
            if (descriptor->ConvertToGetterSetter(nextPropertyIndex))
            {
                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry
            }

            // DictionaryTypeHandlers are not supposed to be shared.
            Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

            // Although we don't actually have CreateTypeForNewScObject on DictionaryTypeHandler, we could potentially
            // transition to a DictionaryTypeHandler with some properties uninitialized.
            if (!descriptor->GetIsInitialized())
            {
                descriptor->SetIsInitialized(true);
                if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
                {
                    // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                    Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);
                    descriptor->SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
                }
                if (!isGetterSet || !isSetterSet)
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(true);
                }
            }
            else if (descriptor->GetIsOnlyOneAccessorInitialized())
            {
                // Only one of getter/setter was initialized, allow the isFixed to stay if we are defining the other one.
                Var oldGetter = GetSlot(instance, descriptor->GetGetterPropertyIndex());
                Var oldSetter = GetSlot(instance, descriptor->GetSetterPropertyIndex());

                if (((getter == oldGetter || !isGetterSet) && oldSetter == library->GetDefaultAccessorFunction()) ||
                    ((setter == oldSetter || !isSetterSet) && oldGetter == library->GetDefaultAccessorFunction()))
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(false);
                }
                else
                {
                    InvalidateFixedField(instance, propertyId, descriptor);
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif

            // don't overwrite an existing accessor with null
            if (getter != nullptr)
            {
                getter = CanonicalizeAccessor(getter, library);
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), getter);
            }
            if (setter != nullptr)
            {
                setter = CanonicalizeAccessor(setter, library);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), setter);
            }
            instance->ChangeType();
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

            // Let's make sure we always have a getter and a setter
            Assert(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr);

            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemAccessors(instance, propertyRecord->GetNumericValue(), getter, setter);
        }

        getter = CanonicalizeAccessor(getter, library);
        setter = CanonicalizeAccessor(setter, library);
        T getterIndex = ::Math::PostInc(nextPropertyIndex);
        T setterIndex = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(getterIndex, setterIndex);
        AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
        newDescriptor.SetIsInitialized(true);
        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
        {
            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
            Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);

            // Even if one (or both?) accessors are the default functions obtained through canonicalization,
            // they are still legitimate functions, so it's ok to mark the whole property as fixed.
            newDescriptor.SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
            if (!isGetterSet || !isSetterSet)
            {
                newDescriptor.SetIsOnlyOneAccessorInitialized(true);
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        SetSlotUnchecked(instance, newDescriptor.GetGetterPropertyIndex(), getter);
        SetSlotUnchecked(instance, newDescriptor.GetSetterPropertyIndex(), setter);

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

        SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

        // Let's make sure we always have a getter and a setter
        Assert(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr);

        return true;
    }